

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O3

void __thiscall
solitaire::piles::FoundationPileWithTwoTest_isSnapshotOfSameObject_Test::
~FoundationPileWithTwoTest_isSnapshotOfSameObject_Test
          (FoundationPileWithTwoTest_isSnapshotOfSameObject_Test *this)

{
  pointer pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
  super_EmptyFoundationPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileWithAceTest_0032b158;
  pCVar1 = (this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.pileCards.
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->super_FoundationPileWithTwoTest).
                                 super_FoundationPileWithAceTest.pileCards.
                                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  (this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
  super_EmptyFoundationPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__EmptyFoundationPileTest_0032afd8;
  this_00 = (this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
            super_EmptyFoundationPileTest.pile.
            super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_F(FoundationPileWithTwoTest, isSnapshotOfSameObject) {
    const auto snapshot = pile->createSnapshot();
    pile->initialize();
    const auto snapshotOfSameObject = pile->createSnapshot();
    const auto snapshotOfSameTypeObject = std::make_shared<FoundationPile>()->createSnapshot();
    SnapshotMock snapshotOfDifferentTypeObject;

    EXPECT_TRUE(snapshot->isSnapshotOfSameObject(*snapshotOfSameObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject));
}